

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qslider.cpp
# Opt level: O0

int __thiscall QSliderPrivate::pixelPosToRangeValue(QSliderPrivate *this,int pos)

{
  int iVar1;
  QSlider *pQVar2;
  QStyle *pQVar3;
  QSliderPrivate *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar4 [12];
  int sliderLength;
  int sliderMax;
  int sliderMin;
  QSlider *q;
  QRect sr;
  QRect gr;
  QStyleOptionSlider opt;
  QWidget *in_stack_ffffffffffffff18;
  QSliderPrivate *pQVar5;
  undefined1 local_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = in_RDI;
  pQVar2 = q_func(in_RDI);
  memcpy(local_88,&DAT_00b227e8,0x80);
  QStyleOptionSlider::QStyleOptionSlider((QStyleOptionSlider *)0x682469);
  (**(code **)(*(long *)&(pQVar2->super_QAbstractSlider).super_QWidget + 0x1a8))(pQVar2,local_88);
  pQVar3 = QWidget::style(in_stack_ffffffffffffff18);
  (**(code **)(*(long *)pQVar3 + 0xd8))(pQVar3,3,local_88,1,pQVar2);
  pQVar3 = QWidget::style(in_stack_ffffffffffffff18);
  auVar4 = (**(code **)(*(long *)pQVar3 + 0xd8))(pQVar3,3,local_88,2,pQVar2);
  if ((in_RDI->super_QAbstractSliderPrivate).orientation == Horizontal) {
    QRect::width((QRect *)in_stack_ffffffffffffff18);
    QRect::x((QRect *)0x682555);
    QRect::right((QRect *)0x682563);
  }
  else {
    QRect::height((QRect *)in_stack_ffffffffffffff18);
    QRect::y((QRect *)0x682588);
    QRect::bottom((QRect *)0x682596);
  }
  iVar1 = QStyle::sliderValueFromPosition
                    (auVar4._8_4_,auVar4._4_4_,auVar4._0_4_,(int)((ulong)pQVar5 >> 0x20),
                     SUB81((ulong)pQVar5 >> 0x18,0));
  QStyleOptionSlider::~QStyleOptionSlider((QStyleOptionSlider *)0x6825e2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QSliderPrivate::pixelPosToRangeValue(int pos) const
{
    Q_Q(const QSlider);
    QStyleOptionSlider opt;
    q->initStyleOption(&opt);
    QRect gr = q->style()->subControlRect(QStyle::CC_Slider, &opt, QStyle::SC_SliderGroove, q);
    QRect sr = q->style()->subControlRect(QStyle::CC_Slider, &opt, QStyle::SC_SliderHandle, q);
    int sliderMin, sliderMax, sliderLength;

    if (orientation == Qt::Horizontal) {
        sliderLength = sr.width();
        sliderMin = gr.x();
        sliderMax = gr.right() - sliderLength + 1;
    } else {
        sliderLength = sr.height();
        sliderMin = gr.y();
        sliderMax = gr.bottom() - sliderLength + 1;
    }
    return QStyle::sliderValueFromPosition(minimum, maximum, pos - sliderMin,
                                           sliderMax - sliderMin, opt.upsideDown);
}